

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandTestTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int *__ptr;
  char *pcVar3;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 != 0x76) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (globalUtilOptind + 1 == argc) {
      __ptr = Kit_TruthTest(argv[globalUtilOptind]);
      iVar2 = 0;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        iVar2 = 0;
      }
    }
    else {
      iVar2 = 0;
      Abc_Print(1,"Input file is not given.\n");
    }
  }
  else {
    Abc_Print(-2,"usage: testtruth [-vh] <file>\n");
    Abc_Print(-2,"\t           printing truth table stats\n");
    pcVar3 = "yes";
    if (!bVar1) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Abc_CommandTestTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int * Kit_TruthTest( char * pFileName );
    int * pResult = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( 1,"Input file is not given.\n" );
        return 0;
    }
    pResult = Kit_TruthTest( argv[globalUtilOptind] );
    ABC_FREE( pResult );
    return 0;

usage:
    Abc_Print( -2, "usage: testtruth [-vh] <file>\n" );
    Abc_Print( -2, "\t           printing truth table stats\n" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}